

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

void __thiscall xemmai::t_slot::t_queue<128UL>::f_next(t_queue<128UL> *this)

{
  t_object ***ppptVar1;
  t_object **local_50;
  t_object **local_40;
  t_object **local_38;
  t_object **local_30;
  t_object **local_28;
  t_object **local_20;
  t_object **tail;
  t_engine *engine;
  t_queue<128UL> *this_local;
  
  engine = (t_engine *)this;
  tail = (t_object **)f_engine();
  t_engine::f_tick((t_engine *)tail);
  if (this->v_head < this->v_objects + 0x7f) {
    this->v_head = this->v_head + 1;
    while (this->v_tail == this->v_head) {
      t_engine::f_wait((t_engine *)tail);
    }
    local_20 = this->v_tail;
    if (local_20 < this->v_head) {
      local_50 = this->v_objects + 0x7f;
    }
    else {
      local_50 = local_20 + -1;
    }
    local_28 = local_50;
    local_30 = this->v_head + 0x10;
    ppptVar1 = std::min<xemmai::t_object*volatile*>(&local_28,&local_30);
    this->v_next = *ppptVar1;
  }
  else {
    this->v_head = this->v_objects;
    while (this->v_tail == this->v_head) {
      t_engine::f_wait((t_engine *)tail);
    }
    local_38 = this->v_tail + -1;
    local_40 = this->v_head + 0x10;
    ppptVar1 = std::min<xemmai::t_object*volatile*>(&local_38,&local_40);
    this->v_next = *ppptVar1;
  }
  return;
}

Assistant:

void t_slot::t_queue<A_SIZE>::f_next() noexcept
{
	auto engine = f_engine();
	engine->f_tick();
	if (v_head < v_objects + A_SIZE - 1) {
		++v_head;
		while (v_tail == v_head) engine->f_wait();
		auto tail = v_tail;
		v_next = std::min(tail < v_head ? v_objects + A_SIZE - 1 : tail - 1, v_head + A_SIZE / 8);
	} else {
		v_head = v_objects;
		while (v_tail == v_head) engine->f_wait();
		v_next = std::min(v_tail - 1, v_head + A_SIZE / 8);
	}
}